

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spcdas.cpp
# Opt level: O0

word atoh(char *s)

{
  size_t sVar1;
  ushort local_24;
  byte local_21;
  word r;
  byte x;
  int sl;
  int i;
  char *s_local;
  
  sVar1 = strlen(s);
  local_24 = 0;
  _r = 0;
  do {
    if ((int)sVar1 <= _r) {
      return local_24;
    }
    local_21 = s[((int)sVar1 + -1) - _r];
    if ((local_21 < 0x30) || (0x39 < local_21)) {
      if ((local_21 < 0x41) || (0x46 < local_21)) {
        if ((local_21 < 0x61) || (0x66 < local_21)) {
          printf("error: invalid hex code [%s] - defaulting to 0000\n",s);
          return 0;
        }
        local_21 = local_21 + 0xa9;
      }
      else {
        local_21 = local_21 - 0x37;
      }
    }
    else {
      local_21 = local_21 - 0x30;
    }
    local_24 = local_24 | (ushort)local_21 << ((byte)(_r << 2) & 0x1f);
    _r = _r + 1;
  } while( true );
}

Assistant:

word atoh(char *s) {
int i, sl=strlen(s);
byte x;
word r = 0;
  for(i=0;i<sl;i++) {
    x=s[(sl-1)-i];
    if(x>='0'&&x<='9')x-='0';
    else if(x>='A'&&x<='F')x-='A'-0x0a;
    else if(x>='a'&&x<='f')x-='a'-0x0a;
    else {
      printf("error: invalid hex code [%s] - defaulting to 0000\n", s);
      return 0;
    }
    r|=x<<(i<<2);
  }
  return r;
}